

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O1

QList<Qt::Key> * qvariant_cast<QList<Qt::Key>>(QList<Qt::Key> *__return_storage_ptr__,QVariant *v)

{
  PrivateShared *pPVar1;
  Key *pKVar2;
  qsizetype qVar3;
  Data *pDVar4;
  bool bVar5;
  QTypedArrayData<Qt::Key> *__old_val;
  QMetaType QVar6;
  long lVar7;
  QTypedArrayData<Qt::Key> *__old_val_1;
  long in_FS_OFFSET;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QList<Qt::Key>_>::metaType;
  local_28.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(v->d).field_0x18 & 0xfffffffffffffffc);
  bVar5 = comparesEqual(&local_28,&local_20);
  if (bVar5) {
    pPVar1 = (v->d).data.shared;
    if (((v->d).field_0x18 & 1) == 0) {
      (v->d).data.shared = (PrivateShared *)0x0;
      (__return_storage_ptr__->d).d = (Data *)pPVar1;
      pKVar2 = *(Key **)((long)&(v->d).data + 8);
      *(undefined8 *)((long)&(v->d).data + 8) = 0;
      (__return_storage_ptr__->d).ptr = pKVar2;
      qVar3 = *(qsizetype *)((long)&(v->d).data + 0x10);
      *(undefined8 *)((long)&(v->d).data + 0x10) = 0;
      (__return_storage_ptr__->d).size = qVar3;
    }
    else {
      lVar7 = (long)*(int *)(pPVar1 + 4);
      pDVar4 = *(Data **)(pPVar1 + lVar7);
      if (*(int *)pPVar1 == 1) {
        *(undefined8 *)(pPVar1 + lVar7) = 0;
        (__return_storage_ptr__->d).d = pDVar4;
        pKVar2 = *(Key **)(pPVar1 + lVar7 + 8);
        *(undefined8 *)(pPVar1 + lVar7 + 8) = 0;
        (__return_storage_ptr__->d).ptr = pKVar2;
        qVar3 = *(qsizetype *)(pPVar1 + lVar7 + 0x10);
        *(undefined8 *)(pPVar1 + lVar7 + 0x10) = 0;
        (__return_storage_ptr__->d).size = qVar3;
      }
      else {
        (__return_storage_ptr__->d).d = pDVar4;
        (__return_storage_ptr__->d).ptr = *(Key **)(pPVar1 + lVar7 + 8);
        (__return_storage_ptr__->d).size = *(qsizetype *)(pPVar1 + lVar7 + 0x10);
        if (pDVar4 != (Data *)0x0) {
          LOCK();
          (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (Key *)0x0;
    (__return_storage_ptr__->d).size = 0;
    QVar6.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    if (((v->d).field_0x18 & 1) != 0) {
      pPVar1 = (v->d).data.shared;
      v = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
    }
    QMetaType::convert(QVar6,v,local_20,__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(QVariant &&v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType) {
        if (!v.d.is_shared) {
            return std::move(*reinterpret_cast<T *>(v.d.data.data));
        } else {
            if (v.d.data.shared->ref.loadRelaxed() == 1)
                return std::move(*reinterpret_cast<T *>(v.d.data.shared->data()));
            else
                return v.d.get<T>();
        }
    }
    if constexpr (std::is_same_v<T, QVariant>) {
        // if the metatype doesn't match, but we want a QVariant, just return the current variant
        return v;
    } if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        // moving a pointer is pointless, just do the same as the const & overload
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}